

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::ParseTopLevelStatement
          (Parser *this,FileDescriptorProto *file,LocationRecorder *root_location)

{
  uint *puVar1;
  bool bVar2;
  ServiceDescriptorProto *service;
  FileOptions *options;
  EnumDescriptorProto *enum_type;
  DescriptorProto *message;
  FileDescriptorProto *containing_file;
  string_view text;
  string_view text_00;
  string_view text_01;
  LocationRecorder location;
  LocationRecorder local_38;
  
  text._M_str = ";";
  text._M_len = 1;
  bVar2 = TryConsumeEndOfDeclaration(this,text,(LocationRecorder *)0x0);
  if (bVar2) {
    return true;
  }
  puVar1 = (uint *)(this->input_->current_).text._M_dataplus._M_p;
  containing_file = (FileDescriptorProto *)(this->input_->current_).text._M_string_length;
  if (containing_file == (FileDescriptorProto *)0x4) {
    if (*puVar1 == 0x6d756e65) {
      LocationRecorder::LocationRecorder
                (&local_38,root_location,5,*(int *)((long)&file->field_0 + 0x40));
      enum_type = (EnumDescriptorProto *)
                  internal::RepeatedPtrFieldBase::AddMessageLite
                            (&(file->field_0)._impl_.enum_type_.super_RepeatedPtrFieldBase,
                             Arena::DefaultConstruct<google::protobuf::EnumDescriptorProto>);
      bVar2 = ParseEnumDefinition(this,enum_type,&local_38,file);
      goto LAB_001cfb9a;
    }
  }
  else if (containing_file == (FileDescriptorProto *)&DAT_00000006) {
    if ((short)puVar1[1] == 0x646e && *puVar1 == 0x65747865) {
      LocationRecorder::LocationRecorder(&local_38,root_location,7);
      bVar2 = ParseExtend(this,&(file->field_0)._impl_.extension_,
                          &(file->field_0)._impl_.message_type_,root_location,4,&local_38,file);
      goto LAB_001cfb9a;
    }
    containing_file = (FileDescriptorProto *)(ulong)(*puVar1 ^ 0x6f706d69);
    if ((short)puVar1[1] == 0x7472 && (*puVar1 ^ 0x6f706d69) == 0) {
      bVar2 = ParseImport(this,&(file->field_0)._impl_.dependency_,
                          &(file->field_0)._impl_.public_dependency_,
                          &(file->field_0)._impl_.weak_dependency_,root_location,file);
      return bVar2;
    }
  }
  else if (containing_file == (FileDescriptorProto *)0x7) {
    if (*(int *)((long)puVar1 + 3) == 0x65676173 && *puVar1 == 0x7373656d) {
      LocationRecorder::LocationRecorder
                (&local_38,root_location,4,*(int *)((long)&file->field_0 + 0x28));
      this->recursion_depth_ = 0x20;
      message = (DescriptorProto *)
                internal::RepeatedPtrFieldBase::AddMessageLite
                          (&(file->field_0)._impl_.message_type_.super_RepeatedPtrFieldBase,
                           Arena::DefaultConstruct<google::protobuf::DescriptorProto>);
      bVar2 = ParseMessageDefinition(this,message,&local_38,file);
      goto LAB_001cfb9a;
    }
    containing_file = (FileDescriptorProto *)(ulong)(*puVar1 ^ 0x76726573);
    if (*(int *)((long)puVar1 + 3) == 0x65636976 && (*puVar1 ^ 0x76726573) == 0) {
      LocationRecorder::LocationRecorder
                (&local_38,root_location,6,*(int *)((long)&file->field_0 + 0x58));
      service = (ServiceDescriptorProto *)
                internal::RepeatedPtrFieldBase::AddMessageLite
                          (&(file->field_0)._impl_.service_.super_RepeatedPtrFieldBase,
                           Arena::DefaultConstruct<google::protobuf::ServiceDescriptorProto>);
      bVar2 = ParseServiceDefinition(this,service,&local_38,file);
      goto LAB_001cfb9a;
    }
  }
  text_00._M_str = "package";
  text_00._M_len = 7;
  bVar2 = LookingAt(this,text_00);
  if (bVar2) {
    bVar2 = ParsePackage(this,file,root_location,containing_file);
    return bVar2;
  }
  text_01._M_str = "option";
  text_01._M_len = 6;
  bVar2 = LookingAt(this,text_01);
  if (!bVar2) {
    RecordError(this,(ErrorMaker)ZEXT816(0x335924));
    return false;
  }
  LocationRecorder::LocationRecorder(&local_38,root_location,8);
  options = FileDescriptorProto::mutable_options(file);
  bVar2 = ParseOption(this,&options->super_Message,&local_38,file,OPTION_STATEMENT);
LAB_001cfb9a:
  LocationRecorder::~LocationRecorder(&local_38);
  return bVar2;
}

Assistant:

bool Parser::ParseTopLevelStatement(FileDescriptorProto* file,
                                    const LocationRecorder& root_location) {
  if (TryConsumeEndOfDeclaration(";", nullptr)) {
    // empty statement; ignore
    return true;
  } else if (LookingAt("message")) {
    LocationRecorder location(root_location,
                              FileDescriptorProto::kMessageTypeFieldNumber,
                              file->message_type_size());
    // Maximum depth allowed by the DescriptorPool.
    recursion_depth_ = internal::cpp::MaxMessageDeclarationNestingDepth();
    return ParseMessageDefinition(file->add_message_type(), location, file);
  } else if (LookingAt("enum")) {
    LocationRecorder location(root_location,
                              FileDescriptorProto::kEnumTypeFieldNumber,
                              file->enum_type_size());
    return ParseEnumDefinition(file->add_enum_type(), location, file);
  } else if (LookingAt("service")) {
    LocationRecorder location(root_location,
                              FileDescriptorProto::kServiceFieldNumber,
                              file->service_size());
    return ParseServiceDefinition(file->add_service(), location, file);
  } else if (LookingAt("extend")) {
    LocationRecorder location(root_location,
                              FileDescriptorProto::kExtensionFieldNumber);
    return ParseExtend(
        file->mutable_extension(), file->mutable_message_type(), root_location,
        FileDescriptorProto::kMessageTypeFieldNumber, location, file);
  } else if (LookingAt("import")) {
    return ParseImport(file->mutable_dependency(),
                       file->mutable_public_dependency(),
                       file->mutable_weak_dependency(), root_location, file);
  } else if (LookingAt("package")) {
    return ParsePackage(file, root_location, file);
  } else if (LookingAt("option")) {
    LocationRecorder location(root_location,
                              FileDescriptorProto::kOptionsFieldNumber);
    return ParseOption(file->mutable_options(), location, file,
                       OPTION_STATEMENT);
  } else {
    RecordError("Expected top-level statement (e.g. \"message\").");
    return false;
  }
}